

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O0

link_type __thiscall
nestl::impl::detail::
rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>::
m_create_node<nestl::has_exceptions::exception_ptr_error,void*>
          (rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
           *this,exception_ptr_error *err,void **args)

{
  bool bVar1;
  node_allocator *alloc;
  undefined1 local_50 [8];
  deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<void_*>_*,_nestl::allocator<nestl::impl::detail::rb_tree_node<void_*>_>_>
  guard;
  link_type l;
  node_allocator *node_alloc;
  void **args_local;
  exception_ptr_error *err_local;
  rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
  *this_local;
  
  alloc = rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
          ::m_get_node_allocator
                    ((rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
                      *)this);
  guard.m_size = (size_t)allocator_traits<nestl::allocator<nestl::impl::detail::rb_tree_node<void_*>_>_>
                         ::allocate<nestl::has_exceptions::exception_ptr_error>
                                   (err,alloc,1,(void *)0x0);
  bVar1 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
  if (bVar1) {
    this_local = (rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
                  *)0x0;
  }
  else {
    nestl::detail::
    deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<void_*>_*,_nestl::allocator<nestl::impl::detail::rb_tree_node<void_*>_>_>
    ::deallocation_scoped_guard
              ((deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<void_*>_*,_nestl::allocator<nestl::impl::detail::rb_tree_node<void_*>_>_>
                *)local_50,alloc,(rb_tree_node<void_*> *)guard.m_size,1);
    rb_tree_node<void*>::construct_val<nestl::has_exceptions::exception_ptr_error,void*>
              ((rb_tree_node<void*> *)guard.m_size,err,args);
    bVar1 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
    if (bVar1) {
      this_local = (rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
                    *)0x0;
    }
    else {
      nestl::detail::
      deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<void_*>_*,_nestl::allocator<nestl::impl::detail::rb_tree_node<void_*>_>_>
      ::release((deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<void_*>_*,_nestl::allocator<nestl::impl::detail::rb_tree_node<void_*>_>_>
                 *)local_50);
      this_local = (rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
                    *)guard.m_size;
    }
    nestl::detail::
    deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<void_*>_*,_nestl::allocator<nestl::impl::detail::rb_tree_node<void_*>_>_>
    ::~deallocation_scoped_guard
              ((deallocation_scoped_guard<nestl::impl::detail::rb_tree_node<void_*>_*,_nestl::allocator<nestl::impl::detail::rb_tree_node<void_*>_>_>
                *)local_50);
  }
  return (link_type)this_local;
}

Assistant:

link_type m_create_node(OperationError& err, Args&&... args) NESTL_NOEXCEPT_SPEC
    {
        node_allocator& node_alloc = m_get_node_allocator();
        link_type l = node_allocator_traits::allocate(err, node_alloc, 1);
        if (err)
        {
            return nullptr;
        }

        nestl::detail::deallocation_scoped_guard<link_type, node_allocator> guard(node_alloc, l, 1);

        l->construct_val(err, std::forward<Args>(args)...);
        if (err)
        {
            return nullptr;
        }

        guard.release();
        return l;
    }